

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_mem_legacy.c
# Opt level: O0

RK_S32 get_free_memory_num(vpu_display_mem_pool *p)

{
  RK_S32 local_20;
  RK_S32 ret;
  vpu_display_mem_pool_impl *p_mempool;
  vpu_display_mem_pool *p_local;
  
  if (p[1].commit_hdl == (_func_RK_S32_vpu_display_mem_pool_ptr_RK_S32_RK_S32 *)0x0) {
    local_20 = 0;
  }
  else {
    local_20 = mpp_buffer_group_unused(p[1].commit_hdl);
  }
  if ((vpu_mem_debug & 1) != 0) {
    _mpp_log_l(4,0,"pool %p ret %d\n","get_free_memory_num",p,local_20);
  }
  return local_20;
}

Assistant:

static RK_S32 get_free_memory_num(vpu_display_mem_pool *p)
{
    vpu_display_mem_pool_impl *p_mempool = (vpu_display_mem_pool_impl *)p;
    RK_S32 ret = (p_mempool->group) ?
                 (mpp_buffer_group_unused(p_mempool->group)) : (0);

    vpu_mem_dbg_func("pool %p ret %d\n", p, ret);
    return ret;
}